

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v7::detail::
     handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_int>&>
               (char spec,
               int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *handler)

{
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *handler_local;
  char spec_local;
  
  if (spec == '\0') {
LAB_00130e59:
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_dec(handler);
    return;
  }
  if (spec == 'B') {
LAB_00130e6f:
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_bin(handler);
  }
  else {
    if (spec == 'L') {
LAB_00130e85:
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num(handler);
      return;
    }
    if (spec != 'X') {
      if (spec == 'b') goto LAB_00130e6f;
      if (spec == 'c') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_chr(handler);
        return;
      }
      if (spec == 'd') goto LAB_00130e59;
      if (spec == 'n') goto LAB_00130e85;
      if (spec == 'o') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_oct(handler);
        return;
      }
      if (spec != 'x') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_error(handler);
      }
    }
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_hex(handler);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
#ifdef FMT_DEPRECATED_N_SPECIFIER
  case 'n':
#endif
  case 'L':
    handler.on_num();
    break;
  case 'c':
    handler.on_chr();
    break;
  default:
    handler.on_error();
  }
}